

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O0

bool duckdb::GreaterThan::Operation<float>(float *left,float *right)

{
  bool bVar1;
  float in_ESI;
  float in_stack_ffffffffffffffec;
  
  bVar1 = GreaterThanFloat<float>(in_ESI,in_stack_ffffffffffffffec);
  return bVar1;
}

Assistant:

bool GreaterThan::Operation(const float &left, const float &right) {
	return GreaterThanFloat<float>(left, right);
}